

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O2

void __thiscall ctemplate::TemplateString::AddToGlobalIdToNameMap(TemplateString *this)

{
  char *__src;
  size_t size;
  const_iterator cVar1;
  UnsafeArena *this_00;
  size_type sVar2;
  char *__dest;
  key_type local_48;
  
  if ((this->id_ & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","IsTemplateIdInitialized(id_)");
    exit(1);
  }
  Mutex::ReaderLock((Mutex *)&(anonymous_namespace)::mutex);
  if ((anonymous_namespace)::template_string_set !=
      (_Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)0x0) {
    local_48.ptr_ = this->ptr_;
    local_48.length_ = this->length_;
    local_48.is_immutable_ = this->is_immutable_;
    local_48._17_7_ = *(undefined7 *)&this->field_0x11;
    local_48.id_ = this->id_;
    cVar1 = std::
            _Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((anonymous_namespace)::template_string_set,&local_48);
    if (cVar1.super__Node_iterator_base<ctemplate::TemplateString,_true>._M_cur !=
        (__node_type *)0x0) {
      Mutex::ReaderUnlock((Mutex *)&(anonymous_namespace)::mutex);
      return;
    }
  }
  Mutex::ReaderUnlock((Mutex *)&(anonymous_namespace)::mutex);
  Mutex::Lock((Mutex *)&(anonymous_namespace)::mutex);
  if ((anonymous_namespace)::template_string_set ==
      (_Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)0x0) {
    (anonymous_namespace)::template_string_set =
         (_Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          *)operator_new(0x40);
    (anonymous_namespace)::template_string_set->_M_buckets =
         &(anonymous_namespace)::template_string_set->_M_single_bucket;
    (anonymous_namespace)::template_string_set->_M_bucket_count = 1;
    ((anonymous_namespace)::template_string_set->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
    (anonymous_namespace)::template_string_set->_M_element_count = 0;
    ((anonymous_namespace)::template_string_set->_M_rehash_policy)._M_max_load_factor = 1.0;
    ((anonymous_namespace)::template_string_set->_M_rehash_policy)._M_next_resize = 0;
    (anonymous_namespace)::template_string_set->_M_single_bucket = (__node_base_ptr)0x0;
  }
  if ((anonymous_namespace)::arena == (UnsafeArena *)0x0) {
    this_00 = (UnsafeArena *)operator_new(0x168);
    UnsafeArena::UnsafeArena(this_00,0x400);
    (anonymous_namespace)::arena = this_00;
  }
  sVar2 = std::
          _Hashtable<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((anonymous_namespace)::template_string_set,this);
  if (sVar2 == 0) {
    if (this->is_immutable_ == true) {
      std::__detail::
      _Insert_base<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)(anonymous_namespace)::template_string_set,this);
    }
    else {
      __src = this->ptr_;
      size = this->length_;
      __dest = UnsafeArena::Alloc((anonymous_namespace)::arena,size);
      memcpy(__dest,__src,size);
      local_48.length_ = this->length_;
      local_48.id_ = this->id_;
      local_48.is_immutable_ = true;
      local_48.ptr_ = __dest;
      std::__detail::
      _Insert<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<ctemplate::TemplateString,_ctemplate::TemplateString,_std::allocator<ctemplate::TemplateString>,_std::__detail::_Identity,_std::equal_to<ctemplate::TemplateString>,_ctemplate::TemplateStringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)(anonymous_namespace)::template_string_set,&local_48);
    }
  }
  Mutex::Unlock((Mutex *)&(anonymous_namespace)::mutex);
  return;
}

Assistant:

LOCKS_EXCLUDED(mutex) {
  // shouldn't be calling this if we don't have an id.
  CHECK(IsTemplateIdInitialized(id_));
  {
    // Check to see if it's already here.
    ReaderMutexLock reader_lock(&mutex);
    if (template_string_set) {
      const TemplateString* iter =
          find_ptr0(*template_string_set, *this);
      if (iter) {
        DCHECK_EQ(TemplateString(ptr_, length_),
                  TemplateString(iter->ptr_, iter->length_))
            << "TemplateId collision!";
        return;
      }
    }
  }
  WriterMutexLock writer_lock(&mutex);
  // First initialize our data structures if we need to.
  if (!template_string_set) {
    template_string_set = new TemplateStringSet;
  }

  if (!arena) {
    arena = new UnsafeArena(1024);  // 1024 was picked out of a hat.
  }

  if (template_string_set->count(*this)) {
    return;
  }
  // If we are immutable, we can store ourselves directly in the map.
  // Otherwise, we need to make an immutable copy.
  if (is_immutable()) {
    template_string_set->insert(*this);
  } else {
    const char* immutable_copy = arena->Memdup(ptr_, length_);
    template_string_set->insert(
        TemplateString(immutable_copy, length_, true, id_));
  }
}